

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

void luaX_init(lua_State *L)

{
  TString *pTVar1;
  lu_byte lVar2;
  long lVar3;
  
  pTVar1 = luaS_newlstr(L,"_ENV",4);
  luaC_fix(L,(GCObject *)pTVar1);
  lVar2 = '\x01';
  lVar3 = 0;
  do {
    pTVar1 = luaS_new(L,*(char **)((long)luaX_tokens + lVar3));
    luaC_fix(L,(GCObject *)pTVar1);
    pTVar1->extra = lVar2;
    lVar3 = lVar3 + 8;
    lVar2 = lVar2 + '\x01';
  } while (lVar3 != 0xb0);
  return;
}

Assistant:

void luaX_init(lua_State *L) {
    int i;
    TString *e = luaS_newliteral(L, LUA_ENV);  /* create env name */
    luaC_fix(L, obj2gco(e));  /* never collect this name */
    for (i = 0; i < NUM_RESERVED; i++) {
        TString *ts = luaS_new(L, luaX_tokens[i]);
        luaC_fix(L, obj2gco(ts));  /* reserved words are never collected */
        ts->extra = cast_byte(i + 1);  /* reserved word */
    }
}